

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O0

void __thiscall
Encapsulation_encapsulationWithMultipleRootHierarchy_Test::TestBody
          (Encapsulation_encapsulationWithMultipleRootHierarchy_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_1c0 [8];
  Message local_1b8 [8];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  string local_168 [32];
  undefined1 local_148 [8];
  ComponentPtr child21;
  string local_130 [32];
  undefined1 local_110 [8];
  ComponentPtr child12;
  string local_f8 [32];
  undefined1 local_d8 [8];
  ComponentPtr child11;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ComponentPtr parent2;
  string local_88 [32];
  undefined1 local_68 [8];
  ComponentPtr parent1;
  ModelPtr model;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  Encapsulation_encapsulationWithMultipleRootHierarchy_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"parent1_component\"/>\n  <component name=\"child11_component\"/>\n  <component name=\"child12_component\"/>\n  <component name=\"parent2_component\"/>\n  <component name=\"child21_component\"/>\n  <encapsulation>\n    <component_ref component=\"parent1_component\">\n      <component_ref component=\"child11_component\"/>\n      <component_ref component=\"child12_component\"/>\n    </component_ref>\n    <component_ref component=\"parent2_component\">\n      <component_ref component=\"child21_component\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Model::create();
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"parent1_component",
             (allocator<char> *)
             ((long)&parent2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parent2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"parent2_component",
             (allocator<char> *)
             ((long)&child11.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child11.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"child11_component",
             (allocator<char> *)
             ((long)&child12.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child12.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"child12_component",
             (allocator<char> *)
             ((long)&child21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,"child21_component",
             (allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parent1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parent1.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  libcellml::Printer::create();
  peVar4 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar4,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b0,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x1b4,pcVar5);
    testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_148);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_110);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_a0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &parent1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Encapsulation, encapsulationWithMultipleRootHierarchy)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent1_component\"/>\n"
        "  <component name=\"child11_component\"/>\n"
        "  <component name=\"child12_component\"/>\n"
        "  <component name=\"parent2_component\"/>\n"
        "  <component name=\"child21_component\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent1_component\">\n"
        "      <component_ref component=\"child11_component\"/>\n"
        "      <component_ref component=\"child12_component\"/>\n"
        "    </component_ref>\n"
        "    <component_ref component=\"parent2_component\">\n"
        "      <component_ref component=\"child21_component\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent1 = libcellml::Component::create();
    parent1->setName("parent1_component");
    libcellml::ComponentPtr parent2 = libcellml::Component::create();
    parent2->setName("parent2_component");
    libcellml::ComponentPtr child11 = libcellml::Component::create();
    child11->setName("child11_component");
    libcellml::ComponentPtr child12 = libcellml::Component::create();
    child12->setName("child12_component");
    libcellml::ComponentPtr child21 = libcellml::Component::create();
    child21->setName("child21_component");

    parent1->addComponent(child11);
    parent1->addComponent(child12);
    parent2->addComponent(child21);

    model->addComponent(parent1);
    model->addComponent(parent2);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}